

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

lua_Integer luaV_mod(CompilerState *compiler_state,lua_Integer m,lua_Integer n)

{
  CompilerState *local_30;
  lua_Integer r;
  lua_Integer n_local;
  lua_Integer m_local;
  CompilerState *compiler_state_local;
  
  if (n + 1U < 2) {
    if (n == 0) {
      handle_error(compiler_state,"attempt to perform \'n%%0\'");
    }
    compiler_state_local = (CompilerState *)0x0;
  }
  else {
    local_30 = (CompilerState *)(m % n);
    if ((local_30 != (CompilerState *)0x0) && ((long)((ulong)local_30 ^ n) < 0)) {
      local_30 = (CompilerState *)((long)local_30->env[0].__jmpbuf + n + -0x40);
    }
    compiler_state_local = local_30;
  }
  return (lua_Integer)compiler_state_local;
}

Assistant:

static lua_Integer luaV_mod(CompilerState *compiler_state, lua_Integer m, lua_Integer n)
{
	if (unlikely(l_castS2U(n) + 1u <= 1u)) { /* special cases: -1 or 0 */
		if (n == 0)
			handle_error(compiler_state, "attempt to perform 'n%%0'");
		return 0; /* m % -1 == 0; avoid overflow with 0x80000...%-1 */
	} else {
		lua_Integer r = m % n;
		if (r != 0 && (r ^ n) < 0) /* 'm/n' would be non-integer negative? */
			r += n;		   /* correct result for different rounding */
		return r;
	}
}